

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  FILE *__stream;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  wasm_byte_vec_t binary;
  wasm_extern_vec_t exports;
  wasm_extern_t *externs [1];
  wasm_extern_vec_t imports;
  wasm_val_vec_t results;
  wasm_val_vec_t args;
  
  puts("Initializing...");
  uVar2 = wasm_engine_new();
  uVar3 = wasm_store_new(uVar2);
  puts("Loading binary...");
  __stream = fopen("hello.wasm","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar4 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&binary,sVar4);
    sVar4 = fread(binary.data,sVar4,1,__stream);
    if (sVar4 == 1) {
      fclose(__stream);
      puts("Validating module...");
      cVar1 = wasm_module_validate(uVar3,&binary);
      if (cVar1 == '\0') {
        pcVar10 = "> Error validating module!";
      }
      else {
        puts("Compiling module...");
        lVar5 = wasm_module_new(uVar3,&binary);
        if (lVar5 == 0) {
          pcVar10 = "> Error compiling module!";
        }
        else {
          wasm_byte_vec_delete(&binary);
          puts("Creating callback...");
          wasm_valtype_vec_new_empty(&imports);
          wasm_valtype_vec_new_empty(&exports);
          uVar6 = wasm_functype_new(&imports,&exports);
          uVar7 = wasm_func_new(uVar3,uVar6,hello_callback);
          wasm_functype_delete(uVar6);
          puts("Instantiating module...");
          externs[0] = (wasm_extern_t *)wasm_func_as_extern(uVar7);
          imports.data = externs;
          imports.size = 1;
          lVar8 = wasm_instance_new(uVar3,lVar5,&imports,0);
          if (lVar8 == 0) {
            pcVar10 = "> Error instantiating module!";
          }
          else {
            wasm_func_delete(uVar7);
            puts("Extracting export...");
            wasm_instance_exports(lVar8,&exports);
            if (exports.size == 0) {
              pcVar10 = "> Error accessing exports!";
            }
            else {
              lVar9 = wasm_extern_as_func(*exports.data);
              if (lVar9 != 0) {
                wasm_module_delete(lVar5);
                wasm_instance_delete(lVar8);
                puts("Calling export...");
                lVar5 = wasm_func_call(lVar9);
                if (lVar5 == 0) {
                  wasm_extern_vec_delete(&exports);
                  puts("Shutting down...");
                  wasm_store_delete(uVar3);
                  wasm_engine_delete(uVar2);
                  pcVar10 = "Done.";
                }
                else {
                  pcVar10 = "> Error calling function!";
                }
                puts(pcVar10);
                return (uint)(lVar5 != 0);
              }
              pcVar10 = "> Error accessing export!";
            }
          }
        }
      }
      goto LAB_00101528;
    }
  }
  pcVar10 = "> Error loading module!";
LAB_00101528:
  puts(pcVar10);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("hello.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Validate.
  printf("Validating module...\n");
  if (!wasm_module_validate(store, &binary)) {
    printf("> Error validating module!\n");
    return 1;
  }

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  own wasm_functype_t* hello_type = wasm_functype_new_0_0();
  own wasm_func_t* hello_func =
    wasm_func_new(store, hello_type, hello_callback);

  wasm_functype_delete(hello_type);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_t* externs[] = { wasm_func_as_extern(hello_func) };
  wasm_extern_vec_t imports = WASM_ARRAY_VEC(externs);
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(hello_func);

  // Extract export.
  printf("Extracting export...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size == 0) {
    printf("> Error accessing exports!\n");
    return 1;
  }
  const wasm_func_t* run_func = wasm_extern_as_func(exports.data[0]);
  if (run_func == NULL) {
    printf("> Error accessing export!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  printf("Calling export...\n");
  wasm_val_vec_t args = WASM_EMPTY_VEC;
  wasm_val_vec_t results = WASM_EMPTY_VEC;
  if (wasm_func_call(run_func, &args, &results)) {
    printf("> Error calling function!\n");
    return 1;
  }

  wasm_extern_vec_delete(&exports);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}